

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkcookiejar.cpp
# Opt level: O2

QList<QNetworkCookie> * __thiscall
QNetworkCookieJar::cookiesForUrl
          (QList<QNetworkCookie> *__return_storage_ptr__,QNetworkCookieJar *this,QUrl *url)

{
  QStringView domain;
  char16_t *pcVar1;
  qsizetype qVar2;
  bool bVar3;
  bool bVar4;
  iterator iVar5;
  iterator iVar6;
  ulong uVar7;
  long lVar8;
  QNetworkCookie *cookie;
  QNetworkCookie *pQVar9;
  long lVar10;
  iterator __i;
  long in_FS_OFFSET;
  QStringView reference;
  QStringView domain_00;
  QStringView s;
  QArrayDataPointer<char16_t> local_d8;
  QArrayDataPointer<char16_t> local_c0;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_88;
  QDateTime now;
  QLatin1StringView local_68;
  QStringView local_58;
  QStringView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar10 = *(long *)(this + 8);
  _now = &DAT_aaaaaaaaaaaaaaaa;
  QDateTime::currentDateTimeUtc();
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QNetworkCookie *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QUrl::scheme();
  local_a8.d = (Data *)0x5;
  local_a8.ptr = L"https";
  bVar3 = ::operator==((QString *)&local_88,(QLatin1StringView *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  pQVar9 = *(QNetworkCookie **)(lVar10 + 0x80);
  lVar10 = *(long *)(lVar10 + 0x88) << 3;
  do {
    if (lVar10 == 0) {
      iVar5 = QList<QNetworkCookie>::begin(__return_storage_ptr__);
      iVar6 = QList<QNetworkCookie>::end(__return_storage_ptr__);
      if (iVar5.i != iVar6.i) {
        uVar7 = (long)iVar6.i - (long)iVar5.i >> 3;
        lVar10 = 0x3f;
        if (uVar7 != 0) {
          for (; uVar7 >> lVar10 == 0; lVar10 = lVar10 + -1) {
          }
        }
        std::
        __introsort_loop<QList<QNetworkCookie>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<QNetworkCookieJar::cookiesForUrl(QUrl_const&)const::__0>>
                  (iVar5.i,iVar6.i,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
        if ((long)iVar6.i - (long)iVar5.i < 0x81) {
          std::
          __insertion_sort<QList<QNetworkCookie>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<QNetworkCookieJar::cookiesForUrl(QUrl_const&)const::__0>>
                    (iVar5.i,iVar6.i);
        }
        else {
          pQVar9 = iVar5.i + 0x10;
          std::
          __insertion_sort<QList<QNetworkCookie>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<QNetworkCookieJar::cookiesForUrl(QUrl_const&)const::__0>>
                    (iVar5.i,pQVar9);
          for (; pQVar9 != iVar6.i; pQVar9 = pQVar9 + 1) {
            std::
            __unguarded_linear_insert<QList<QNetworkCookie>::iterator,__gnu_cxx::__ops::_Val_comp_iter<QNetworkCookieJar::cookiesForUrl(QUrl_const&)const::__0>>
                      (pQVar9);
          }
        }
      }
      QDateTime::~QDateTime(&now);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return __return_storage_ptr__;
    }
    if ((bVar3) || (bVar4 = QNetworkCookie::isSecure(pQVar9), !bVar4)) {
      bVar4 = QNetworkCookie::isSessionCookie(pQVar9);
      if (!bVar4) {
        QNetworkCookie::expirationDate((QNetworkCookie *)&local_88);
        bVar4 = operator<((QDateTime *)&local_88,&now);
        QDateTime::~QDateTime((QDateTime *)&local_88);
        if (bVar4) goto LAB_00183432;
      }
      local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d._0_4_ = 0xaaaaaaaa;
      local_88.d._4_4_ = 0xaaaaaaaa;
      local_88.ptr._0_4_ = 0xaaaaaaaa;
      local_88.ptr._4_4_ = 0xaaaaaaaa;
      QUrl::host(&local_88,url,0x7f00000);
      local_a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_a8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QNetworkCookie::domain((QString *)&local_a8,pQVar9);
      domain_00.m_data._4_4_ = local_88.ptr._4_4_;
      domain_00.m_data._0_4_ = local_88.ptr._0_4_;
      reference.m_data = local_a8.ptr;
      reference.m_size = local_a8.size;
      domain_00.m_size = local_88.size;
      bVar4 = isParentDomain(domain_00,reference);
      if (bVar4) {
        QUrl::path(&local_c0,url,0x7f00000);
        qVar2 = local_c0.size;
        pcVar1 = local_c0.ptr;
        QNetworkCookie::path((QString *)&local_d8,pQVar9);
        local_48.m_size = qVar2;
        local_48.m_data = pcVar1;
        local_58.m_size = local_d8.size;
        local_58.m_data = local_d8.ptr;
        if (qVar2 == 0) {
          local_68.m_size = 1;
          local_68.m_data = "/";
          bVar4 = comparesEqual(&local_68,&local_58);
          if (!bVar4) goto LAB_0018331f;
          lVar8 = 0;
LAB_0018334a:
          if ((lVar8 == local_58.m_size) ||
             (((local_58.m_size != 0 && (local_58.m_data[local_58.m_size + -1] == L'/')) ||
              (local_48.m_data[local_58.m_size] == L'/')))) {
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
            local_c0.d = (Data *)local_a8.size;
            local_c0.ptr = local_a8.ptr;
            if (((Data *)local_a8.size != (Data *)0x0) && (*local_a8.ptr == L'.')) {
              local_c0.ptr = local_a8.ptr + 1;
              local_c0.d = (Data *)((long)&(((Data *)(local_a8.size + -0x10))->super_QArrayData).
                                           alloc + 7);
            }
            local_d8.ptr = (char16_t *)CONCAT44(local_88.ptr._4_4_,local_88.ptr._0_4_);
            local_d8.d = (Data *)local_88.size;
            bVar4 = operator!=((QStringView *)&local_d8,(QStringView *)&local_c0);
            if ((!bVar4) ||
               (domain.m_data = local_c0.ptr, domain.m_size = (qsizetype)local_c0.d,
               bVar4 = qIsEffectiveTLD(domain), !bVar4)) {
              QList<QNetworkCookie>::emplaceBack<QNetworkCookie_const&>
                        (__return_storage_ptr__,pQVar9);
            }
            goto LAB_00183420;
          }
        }
        else {
LAB_0018331f:
          s.m_data = local_58.m_data;
          s.m_size = local_58.m_size;
          bVar4 = QStringView::startsWith(&local_48,s,CaseSensitive);
          lVar8 = local_48.m_size;
          if (bVar4) goto LAB_0018334a;
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
      }
LAB_00183420:
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    }
LAB_00183432:
    pQVar9 = pQVar9 + 1;
    lVar10 = lVar10 + -8;
  } while( true );
}

Assistant:

QList<QNetworkCookie> QNetworkCookieJar::cookiesForUrl(const QUrl &url) const
{
//     \b Warning! This is only a dumb implementation!
//     It does NOT follow all of the recommendations from
//     http://wp.netscape.com/newsref/std/cookie_spec.html
//     It does not implement a very good cross-domain verification yet.

    Q_D(const QNetworkCookieJar);
    const QDateTime now = QDateTime::currentDateTimeUtc();
    QList<QNetworkCookie> result;
    const bool isEncrypted = url.scheme() == "https"_L1;

    // scan our cookies for something that matches
    for (const auto &cookie : std::as_const(d->allCookies)) {
        if (!isEncrypted && cookie.isSecure())
            continue;
        if (!cookie.isSessionCookie() && cookie.expirationDate() < now)
            continue;
        const QString urlHost = url.host();
        const QString cookieDomain = cookie.domain();
        if (!isParentDomain(urlHost, cookieDomain))
            continue;
        if (!isParentPath(url.path(), cookie.path()))
            continue;

        QStringView domain = cookieDomain;
        if (domain.startsWith(u'.')) /// Qt6?: remove when compliant with RFC6265
            domain = domain.sliced(1);
#if QT_CONFIG(topleveldomain)
        if (urlHost != domain && qIsEffectiveTLD(domain))
            continue;
#else
        if (!domain.contains(u'.') && urlHost != domain)
            continue;
#endif // topleveldomain

        result += cookie;
    }

    auto longerPath = [](const auto &c1, const auto &c2)
                      { return c1.path().size() > c2.path().size(); };
    std::sort(result.begin(), result.end(), longerPath);
    return result;
}